

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  rawSeq *prVar1;
  BYTE *iend;
  BYTE *pBVar2;
  BYTE *pBVar3;
  seqDef *psVar4;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar8;
  uint uVar9;
  BYTE *pBVar10;
  ulong uVar11;
  ZSTD_dictMode_e dictMode;
  BYTE *ip;
  BYTE *pBVar12;
  long lVar13;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  U32 UVar14;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    dictMode = (uint)(ms->dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
  }
  uVar7 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE = ZSTD_selectBlockCompressor((ms->cParams).strategy,dictMode);
  if (rawSeqStore->size < rawSeqStore->pos) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456d,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < rawSeqStore->size) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x456e,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  pBVar10 = (BYTE *)(srcSize + (long)src);
  do {
    uVar15 = rawSeqStore->pos;
    if ((rawSeqStore->size <= uVar15) || (pBVar10 <= src)) break;
    prVar1 = rawSeqStore->seq + uVar15;
    uVar16._0_4_ = prVar1->offset;
    uVar16._4_4_ = prVar1->litLength;
    if ((undefined4)uVar16 == 0) {
      __assert_fail("sequence.offset > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x454a,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
    }
    uVar17 = uVar16 >> 0x20;
    uVar6 = rawSeqStore->seq[uVar15].matchLength;
    uVar11 = (ulong)uVar6;
    uVar9 = (uint)((long)pBVar10 - (long)src);
    if (uVar9 < uVar16._4_4_ + uVar6) {
      uVar15 = uVar16;
      if (uVar9 - uVar16._4_4_ < uVar7) {
        uVar15 = 0;
      }
      if (uVar9 < (uint)uVar16._4_4_ || uVar9 - uVar16._4_4_ == 0) {
        uVar15 = 0;
      }
      else {
        uVar11 = (ulong)(uVar9 - uVar16._4_4_);
      }
      ZSTD_ldm_skipSequences(rawSeqStore,(long)pBVar10 - (long)src & 0xffffffff,uVar7);
      uVar16 = uVar15;
    }
    else {
      rawSeqStore->pos = uVar15 + 1;
    }
    UVar14 = (U32)uVar16;
    if (UVar14 != 0) {
      iend = (BYTE *)((long)src + uVar17);
      if (pBVar10 < iend + uVar11) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x4579,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                     );
      }
      uVar6 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar6) {
        uVar9 = (uVar6 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar9) {
          uVar9 = 0x200;
        }
        ms->nextToUpdate = uVar6 - uVar9;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar8 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar17);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = UVar14;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x2038,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203a,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar2 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar2 + sVar8) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (pBVar10 < iend) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x203c,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      ip = iend + -sVar8;
      if (pBVar10 + -0x20 < iend) {
        ZSTD_safecopyLiterals(pBVar2,ip,iend,pBVar10 + -0x20);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 8);
        *(undefined8 *)pBVar2 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar2 + 8) = uVar5;
        if (0x10 < sVar8) {
          pBVar3 = seqStore->lit;
          pBVar2 = pBVar3 + 0x10;
          pBVar12 = ip + 0x10;
          if ((BYTE *)0xffffffffffffffe8 < pBVar2 + (-8 - (long)pBVar12)) {
            __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1268,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          if ((BYTE *)0xffffffffffffffe0 < pBVar2 + (-0x10 - (long)pBVar12)) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar5 = *(undefined8 *)(ip + 0x18);
          *(undefined8 *)pBVar2 = *(undefined8 *)pBVar12;
          *(undefined8 *)(pBVar3 + 0x18) = uVar5;
          if (0x20 < (long)sVar8) {
            lVar13 = 0;
            do {
              uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar13 + (uVar17 - sVar8) + 0x20) + 8);
              pBVar2 = pBVar3 + lVar13 + 0x20;
              *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar13 + (uVar17 - sVar8) + 0x20);
              *(undefined8 *)(pBVar2 + 8) = uVar5;
              uVar5 = *(undefined8 *)((BYTE *)((long)src + lVar13 + (uVar17 - sVar8) + 0x30) + 8);
              *(undefined8 *)(pBVar2 + 0x10) =
                   *(undefined8 *)((long)src + lVar13 + (uVar17 - sVar8) + 0x30);
              *(undefined8 *)(pBVar2 + 0x18) = uVar5;
              lVar13 = lVar13 + 0x20;
            } while (pBVar2 + 0x20 < pBVar3 + sVar8);
          }
        }
      }
      seqStore->lit = seqStore->lit + sVar8;
      if (0xffff < sVar8) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x204d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 1;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      uVar6 = (int)uVar11 - 3;
      psVar4 = seqStore->sequences;
      psVar4->litLength = (U16)sVar8;
      psVar4->offset = UVar14 + 3;
      if (0xffff < uVar6) {
        if (seqStore->longLengthID != 0) {
          __assert_fail("seqStorePtr->longLengthID == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2058,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthID = 2;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar4 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar4->matchLength = (U16)uVar6;
      seqStore->sequences = psVar4 + 1;
      src = iend + uVar11;
    }
  } while (UVar14 != 0);
  uVar7 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar7) {
    uVar6 = (uVar7 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar6) {
      uVar6 = 0x200;
    }
    ms->nextToUpdate = uVar7 - uVar6;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar8 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pBVar10 - (long)src);
  return sVar8;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}